

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

void google::protobuf::internal::WireFormat::SerializeFieldWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  uint uVar5;
  Type TVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pMVar8;
  MapKey *key;
  MapValueRef *value_16;
  Descriptor *pDVar9;
  MessageOptions *pMVar10;
  size_t sVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  reference ppMVar12;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  char *pcVar13;
  char *pcVar14;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  string *local_480;
  undefined8 local_430;
  EnumValueDescriptor *local_408;
  MessageLite *local_3e8;
  MessageLite *local_3e0;
  MessageLite *local_3c0;
  MessageLite *local_3b8;
  byte local_397;
  double local_388;
  float local_368;
  int64 local_350;
  int32 local_330;
  uint64 local_318;
  uint32 local_2f8;
  uint64 local_2e0;
  uint32 local_2c0;
  int64 local_2a8;
  int32 local_288;
  int64 local_270;
  int32 local_254;
  string *value_15;
  string scratch_1;
  string *value_14;
  string scratch;
  bool strict_utf8_check;
  EnumValueDescriptor *value_13;
  bool value_12;
  double value_11;
  float value_10;
  int64 value_9;
  int32 value_8;
  uint64 value_7;
  uint32 value_6;
  uint64 value_5;
  uint32 value_4;
  int64 value_3;
  int32 value_2;
  int64 value_1;
  int32 value;
  int j;
  size_t data_size;
  undefined1 local_110 [7];
  bool is_packed;
  undefined1 local_f8 [8];
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  undefined1 local_d8 [4];
  int count;
  undefined1 local_a8 [8];
  MapIterator it_1;
  undefined1 local_68 [8];
  MapValueRef map_value;
  __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
  local_50;
  iterator it;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapFieldBase *map_field;
  Reflection *message_reflection;
  CodedOutputStream *output_local;
  Message *message_local;
  FieldDescriptor *field_local;
  Reflection *reflection;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])();
  reflection = (Reflection *)CONCAT44(extraout_var,iVar3);
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    pDVar9 = FieldDescriptor::containing_type(field);
    pMVar10 = Descriptor::options(pDVar9);
    bVar1 = MessageOptions::message_set_wire_format(pMVar10);
    if (((bVar1) && (CVar4 = FieldDescriptor::cpp_type(field), CVar4 == CPPTYPE_MESSAGE)) &&
       (bVar1 = FieldDescriptor::is_repeated(field), !bVar1)) {
      SerializeMessageSetItemWithCachedSizes(field,message,output);
      return;
    }
  }
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    iVar3 = (*reflection->_vptr_Reflection[0x5b])(reflection,message,field);
    bVar1 = MapFieldBase::IsMapValid((MapFieldBase *)CONCAT44(extraout_var_00,iVar3));
    if (bVar1) {
      bVar1 = io::CodedOutputStream::IsSerializationDeterministic(output);
      if (!bVar1) {
        (*reflection->_vptr_Reflection[0x58])(local_a8,reflection,message,field);
        while( true ) {
          (*reflection->_vptr_Reflection[0x59])(local_d8,reflection,message,field);
          bVar1 = protobuf::operator!=((MapIterator *)local_a8,(MapIterator *)local_d8);
          MapIterator::~MapIterator((MapIterator *)local_d8);
          if (!bVar1) break;
          key = MapIterator::GetKey((MapIterator *)local_a8);
          value_16 = MapIterator::GetValueRef((MapIterator *)local_a8);
          SerializeMapEntry(field,key,value_16,output);
          MapIterator::operator++((MapIterator *)local_a8);
        }
        MapIterator::~MapIterator((MapIterator *)local_a8);
        return;
      }
      MapKeySorter::SortKey
                ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)&it,
                 message,reflection,field);
      local_50._M_current =
           (MapKey *)
           std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::begin
                     ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *
                      )&it);
      while( true ) {
        map_value._8_8_ =
             std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::end
                       ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                         *)&it);
        bVar1 = __gnu_cxx::operator!=
                          (&local_50,
                           (__normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                            *)&map_value.type_);
        if (!bVar1) break;
        MapValueRef::MapValueRef((MapValueRef *)local_68);
        pMVar8 = __gnu_cxx::
                 __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                 ::operator*(&local_50);
        (*reflection->_vptr_Reflection[0x56])(reflection,message,field,pMVar8,local_68);
        pMVar8 = __gnu_cxx::
                 __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
                 ::operator*(&local_50);
        SerializeMapEntry(field,pMVar8,(MapValueRef *)local_68,output);
        __gnu_cxx::
        __normal_iterator<google::protobuf::MapKey_*,_std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>_>
        ::operator++(&local_50);
      }
      std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)&it)
      ;
      return;
    }
  }
  map_entries.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (*reflection->_vptr_Reflection[6])(reflection,message,field);
  }
  else {
    pDVar9 = FieldDescriptor::containing_type(field);
    pMVar10 = Descriptor::options(pDVar9);
    bVar1 = MessageOptions::map_entry(pMVar10);
    if (bVar1) {
      map_entries.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      uVar5 = (*reflection->_vptr_Reflection[5])(reflection,message,field);
      if ((uVar5 & 1) != 0) {
        map_entries.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
    }
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)local_f8);
  if (((1 < map_entries.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) &&
      (bVar1 = FieldDescriptor::is_map(field), bVar1)) &&
     (bVar1 = io::CodedOutputStream::IsSerializationDeterministic(output), bVar1)) {
    DynamicMapSorter::Sort
              ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)local_110,message,
               map_entries.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,reflection,field);
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    operator=((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *)local_f8,
              (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *)local_110);
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    ~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)local_110);
  }
  bVar1 = FieldDescriptor::is_packed(field);
  if ((bVar1) &&
     (0 < map_entries.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_)) {
    iVar3 = FieldDescriptor::number(field);
    WireFormatLite::WriteTag(iVar3,WIRETYPE_LENGTH_DELIMITED,output);
    sVar11 = FieldDataOnlyByteSize(field,message);
    value = (int32)sVar11;
    io::CodedOutputStream::WriteVarint32(output,value);
  }
  for (value_1._4_4_ = 0;
      (int)value_1._4_4_ <
      map_entries.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; value_1._4_4_ = value_1._4_4_ + 1) {
    TVar6 = FieldDescriptor::type(field);
    switch(TVar6) {
    case TYPE_DOUBLE:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        (*reflection->_vptr_Reflection[0x2f])(reflection,message,field,(ulong)value_1._4_4_);
        local_388 = extraout_XMM0_Qa;
      }
      else {
        (*reflection->_vptr_Reflection[0x16])(reflection,message,field);
        local_388 = extraout_XMM0_Qa_00;
      }
      if (bVar1) {
        WireFormatLite::WriteDoubleNoTag(local_388,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteDouble(iVar3,local_388,output);
      }
      break;
    case TYPE_FLOAT:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        (*reflection->_vptr_Reflection[0x2e])(reflection,message,field,(ulong)value_1._4_4_);
        local_368 = extraout_XMM0_Da;
      }
      else {
        (*reflection->_vptr_Reflection[0x15])(reflection,message,field);
        local_368 = extraout_XMM0_Da_00;
      }
      if (bVar1) {
        WireFormatLite::WriteFloatNoTag(local_368,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteFloat(iVar3,local_368,output);
      }
      break;
    case TYPE_INT64:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,(ulong)value_1._4_4_)
        ;
        local_270 = CONCAT44(extraout_var_01,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
        local_270 = CONCAT44(extraout_var_02,iVar3);
      }
      if (bVar1) {
        WireFormatLite::WriteInt64NoTag(local_270,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteInt64(iVar3,local_270,output);
      }
      break;
    case TYPE_UINT64:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x2d])(reflection,message,field,(ulong)value_1._4_4_)
        ;
        local_2e0 = CONCAT44(extraout_var_05,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x14])(reflection,message,field);
        local_2e0 = CONCAT44(extraout_var_06,iVar3);
      }
      if (bVar1) {
        WireFormatLite::WriteUInt64NoTag(local_2e0,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteUInt64(iVar3,local_2e0,output);
      }
      break;
    case TYPE_INT32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_254 = (*reflection->_vptr_Reflection[0x2a])
                              (reflection,message,field,(ulong)value_1._4_4_);
      }
      else {
        local_254 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
      }
      if (bVar1) {
        WireFormatLite::WriteInt32NoTag(local_254,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteInt32(iVar3,local_254,output);
      }
      break;
    case TYPE_FIXED64:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x2d])(reflection,message,field,(ulong)value_1._4_4_)
        ;
        local_318 = CONCAT44(extraout_var_07,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x14])(reflection,message,field);
        local_318 = CONCAT44(extraout_var_08,iVar3);
      }
      if (bVar1) {
        WireFormatLite::WriteFixed64NoTag(local_318,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteFixed64(iVar3,local_318,output);
      }
      break;
    case TYPE_FIXED32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_2f8 = (*reflection->_vptr_Reflection[0x2c])
                              (reflection,message,field,(ulong)value_1._4_4_);
      }
      else {
        local_2f8 = (*reflection->_vptr_Reflection[0x13])(reflection,message,field);
      }
      if (bVar1) {
        WireFormatLite::WriteFixed32NoTag(local_2f8,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteFixed32(iVar3,local_2f8,output);
      }
      break;
    case TYPE_BOOL:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x30])(reflection,message,field,(ulong)value_1._4_4_)
        ;
        local_397 = (byte)iVar3;
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x17])(reflection,message,field);
        local_397 = (byte)iVar3;
      }
      if (bVar1) {
        WireFormatLite::WriteBoolNoTag((bool)(local_397 & 1),output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteBool(iVar3,(bool)(local_397 & 1),output);
      }
      break;
    case TYPE_STRING:
      scratch.field_2._M_local_buf[0xf] = StrictUtf8Check(field);
      std::__cxx11::string::string((string *)&value_14);
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x35])
                          (reflection,message,field,(ulong)value_1._4_4_,&value_14);
        local_430 = CONCAT44(extraout_var_17,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field,&value_14);
        local_430 = CONCAT44(extraout_var_18,iVar3);
      }
      scratch_1.field_2._8_8_ = local_430;
      if ((scratch.field_2._M_local_buf[0xf] & 1U) == 0) {
        pcVar13 = (char *)std::__cxx11::string::data();
        iVar3 = std::__cxx11::string::length();
        FieldDescriptor::full_name_abi_cxx11_(field);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        VerifyUTF8StringNamedField(pcVar13,iVar3,SERIALIZE,pcVar14);
      }
      else {
        pcVar13 = (char *)std::__cxx11::string::data();
        iVar3 = std::__cxx11::string::length();
        FieldDescriptor::full_name_abi_cxx11_(field);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        WireFormatLite::VerifyUtf8String(pcVar13,iVar3,SERIALIZE,pcVar14);
      }
      iVar3 = FieldDescriptor::number(field);
      WireFormatLite::WriteString(iVar3,(string *)scratch_1.field_2._8_8_,output);
      std::__cxx11::string::~string((string *)&value_14);
      break;
    case TYPE_GROUP:
      iVar3 = FieldDescriptor::number(field);
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        bVar2 = std::
                vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                ::empty((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         *)local_f8);
        if (bVar2) {
          iVar7 = (*reflection->_vptr_Reflection[0x34])
                            (reflection,message,field,(ulong)value_1._4_4_);
          local_3b8 = (MessageLite *)CONCAT44(extraout_var_11,iVar7);
        }
        else {
          ppMVar12 = std::
                     vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     ::operator[]((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                   *)local_f8,(long)(int)value_1._4_4_);
          local_3b8 = &(*ppMVar12)->super_MessageLite;
        }
        local_3c0 = local_3b8;
      }
      else {
        iVar7 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field,0);
        local_3c0 = (MessageLite *)CONCAT44(extraout_var_12,iVar7);
      }
      WireFormatLite::WriteGroup(iVar3,local_3c0,output);
      break;
    case TYPE_MESSAGE:
      iVar3 = FieldDescriptor::number(field);
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        bVar2 = std::
                vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                ::empty((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         *)local_f8);
        if (bVar2) {
          iVar7 = (*reflection->_vptr_Reflection[0x34])
                            (reflection,message,field,(ulong)value_1._4_4_);
          local_3e0 = (MessageLite *)CONCAT44(extraout_var_13,iVar7);
        }
        else {
          ppMVar12 = std::
                     vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     ::operator[]((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                   *)local_f8,(long)(int)value_1._4_4_);
          local_3e0 = &(*ppMVar12)->super_MessageLite;
        }
        local_3e8 = local_3e0;
      }
      else {
        iVar7 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field,0);
        local_3e8 = (MessageLite *)CONCAT44(extraout_var_14,iVar7);
      }
      WireFormatLite::WriteMessage(iVar3,local_3e8,output);
      break;
    case TYPE_BYTES:
      std::__cxx11::string::string((string *)&value_15);
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x35])
                          (reflection,message,field,(ulong)value_1._4_4_,&value_15);
        local_480 = (string *)CONCAT44(extraout_var_19,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field,&value_15);
        local_480 = (string *)CONCAT44(extraout_var_20,iVar3);
      }
      iVar3 = FieldDescriptor::number(field);
      WireFormatLite::WriteBytes(iVar3,local_480,output);
      std::__cxx11::string::~string((string *)&value_15);
      break;
    case TYPE_UINT32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_2c0 = (*reflection->_vptr_Reflection[0x2c])
                              (reflection,message,field,(ulong)value_1._4_4_);
      }
      else {
        local_2c0 = (*reflection->_vptr_Reflection[0x13])(reflection,message,field);
      }
      if (bVar1) {
        WireFormatLite::WriteUInt32NoTag(local_2c0,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteUInt32(iVar3,local_2c0,output);
      }
      break;
    case TYPE_ENUM:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x32])(reflection,message,field,(ulong)value_1._4_4_)
        ;
        local_408 = (EnumValueDescriptor *)CONCAT44(extraout_var_15,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x19])(reflection,message,field);
        local_408 = (EnumValueDescriptor *)CONCAT44(extraout_var_16,iVar3);
      }
      if (bVar1) {
        iVar3 = EnumValueDescriptor::number(local_408);
        WireFormatLite::WriteEnumNoTag(iVar3,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        iVar7 = EnumValueDescriptor::number(local_408);
        WireFormatLite::WriteEnum(iVar3,iVar7,output);
      }
      break;
    case TYPE_SFIXED32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_330 = (*reflection->_vptr_Reflection[0x2a])
                              (reflection,message,field,(ulong)value_1._4_4_);
      }
      else {
        local_330 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
      }
      if (bVar1) {
        WireFormatLite::WriteSFixed32NoTag(local_330,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteSFixed32(iVar3,local_330,output);
      }
      break;
    case TYPE_SFIXED64:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,(ulong)value_1._4_4_)
        ;
        local_350 = CONCAT44(extraout_var_09,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
        local_350 = CONCAT44(extraout_var_10,iVar3);
      }
      if (bVar1) {
        WireFormatLite::WriteSFixed64NoTag(local_350,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteSFixed64(iVar3,local_350,output);
      }
      break;
    case TYPE_SINT32:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        local_288 = (*reflection->_vptr_Reflection[0x2a])
                              (reflection,message,field,(ulong)value_1._4_4_);
      }
      else {
        local_288 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
      }
      if (bVar1) {
        WireFormatLite::WriteSInt32NoTag(local_288,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteSInt32(iVar3,local_288,output);
      }
      break;
    case MAX_TYPE:
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2) {
        iVar3 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,(ulong)value_1._4_4_)
        ;
        local_2a8 = CONCAT44(extraout_var_03,iVar3);
      }
      else {
        iVar3 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
        local_2a8 = CONCAT44(extraout_var_04,iVar3);
      }
      if (bVar1) {
        WireFormatLite::WriteSInt64NoTag(local_2a8,output);
      }
      else {
        iVar3 = FieldDescriptor::number(field);
        WireFormatLite::WriteSInt64(iVar3,local_2a8,output);
      }
    }
  }
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)local_f8);
  return;
}

Assistant:

void WireFormat::SerializeFieldWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    SerializeMessageSetItemWithCachedSizes(field, message, output);
    return;
  }

  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    MapFieldBase* map_field =
        message_reflection->MapData(const_cast<Message*>(&message), field);
    if (map_field->IsMapValid()) {
      if (output->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueRef map_value;
          message_reflection->InsertOrLookupMapValue(
              const_cast<Message*>(&message), field, *it, &map_value);
          SerializeMapEntry(field, *it, map_value, output);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          SerializeMapEntry(field, it.GetKey(), it.GetValueRef(), output);
        }
      }

      return;
    }
  }

  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && output->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  const bool is_packed = field->is_packed();
  if (is_packed && count > 0) {
    WireFormatLite::WriteTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    const size_t data_size = FieldDataOnlyByteSize(field, message);
    output->WriteVarint32(data_size);
  }

  for (int j = 0; j < count; j++) {
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        const CPPTYPE value = field->is_repeated() ?                           \
                              message_reflection->GetRepeated##CPPTYPE_METHOD( \
                                message, field, j) :                           \
                              message_reflection->Get##CPPTYPE_METHOD(         \
                                message, field);                               \
        if (is_packed) {                                                       \
          WireFormatLite::Write##TYPE_METHOD##NoTag(value, output);            \
        } else {                                                               \
          WireFormatLite::Write##TYPE_METHOD(field->number(), value, output);  \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PRIMITIVE_TYPE( INT32,  int32,  Int32,  Int32)
      HANDLE_PRIMITIVE_TYPE( INT64,  int64,  Int64,  Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32,  int32, SInt32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64,  int64, SInt64,  Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE( FIXED32, uint32,  Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE( FIXED64, uint64,  Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32,  int32, SFixed32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64,  int64, SFixed64,  Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT , float , Float , Float )
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
      case FieldDescriptor::TYPE_##TYPE:                                    \
        WireFormatLite::Write##TYPE_METHOD(                                 \
              field->number(),                                              \
              field->is_repeated() ?                                        \
                (map_entries.empty() ?                                      \
                     message_reflection->GetRepeated##CPPTYPE_METHOD(       \
                                     message, field, j) :                   \
                     *map_entries[j]) :                                     \
                message_reflection->Get##CPPTYPE_METHOD(message, field),    \
              output);                                                      \
        break;

      HANDLE_TYPE(GROUP  , Group  , Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value = field->is_repeated() ?
          message_reflection->GetRepeatedEnum(message, field, j) :
          message_reflection->GetEnum(message, field);
        if (is_packed) {
          WireFormatLite::WriteEnumNoTag(value->number(), output);
        } else {
          WireFormatLite::WriteEnum(field->number(), value->number(), output);
        }
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name().c_str());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name().c_str());
        }
        WireFormatLite::WriteString(field->number(), value, output);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        WireFormatLite::WriteBytes(field->number(), value, output);
        break;
      }
    }
  }
}